

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O0

void leveldb_compact_range
               (leveldb_t *db,char *start_key,size_t start_key_len,char *limit_key,
               size_t limit_key_len)

{
  DB *pDVar1;
  undefined1 *local_90;
  size_t *local_80;
  Slice local_70;
  Slice local_60;
  undefined1 local_50 [8];
  Slice b;
  Slice a;
  size_t limit_key_len_local;
  char *limit_key_local;
  size_t start_key_len_local;
  char *start_key_local;
  leveldb_t *db_local;
  
  leveldb::Slice::Slice((Slice *)&b.size_);
  leveldb::Slice::Slice((Slice *)local_50);
  pDVar1 = db->rep;
  if (start_key == (char *)0x0) {
    local_80 = (size_t *)0x0;
  }
  else {
    leveldb::Slice::Slice(&local_60,start_key,start_key_len);
    b.size_ = (size_t)local_60.data_;
    local_80 = &b.size_;
  }
  if (limit_key == (char *)0x0) {
    local_90 = (undefined1 *)0x0;
  }
  else {
    leveldb::Slice::Slice(&local_70,limit_key,limit_key_len);
    local_50 = (undefined1  [8])local_70.data_;
    b.data_ = (char *)local_70.size_;
    local_90 = local_50;
  }
  (*pDVar1->_vptr_DB[0xb])(pDVar1,local_80,local_90);
  return;
}

Assistant:

void leveldb_compact_range(leveldb_t* db, const char* start_key,
                           size_t start_key_len, const char* limit_key,
                           size_t limit_key_len) {
  Slice a, b;
  db->rep->CompactRange(
      // Pass null Slice if corresponding "const char*" is null
      (start_key ? (a = Slice(start_key, start_key_len), &a) : nullptr),
      (limit_key ? (b = Slice(limit_key, limit_key_len), &b) : nullptr));
}